

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

dxil_spv_result
dxil_spv_converter_add_option(dxil_spv_converter converter,dxil_spv_option_base *option)

{
  byte bVar1;
  byte bVar2;
  dxil_spv_option dVar3;
  dxil_spv_option dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  dxil_spv_option dVar7;
  dxil_spv_bool dVar8;
  dxil_spv_result dVar9;
  tuple<dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
  this;
  undefined8 uVar10;
  ulong uVar11;
  OptionShaderSourceFile helper;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  __uniq_ptr_impl<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
  local_38;
  
  dVar8 = dxil_spv_converter_supports_option(option->type);
  dVar9 = DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
  if (dVar8 != '\0') {
    switch(option->type) {
    case DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = ((ulong)((char)dVar3 != DXIL_SPV_OPTION_INVALID) << 0x20) + 1;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderDemoteToHelper,std::default_delete<dxil_spv::OptionShaderDemoteToHelper>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_DUAL_SOURCE_BLENDING:
      uVar10 = 2;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000002;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDualSourceBlending,std::default_delete<dxil_spv::OptionDualSourceBlending>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_OUTPUT_SWIZZLE:
      uVar10 = *(undefined8 *)(option + 2);
      dVar3 = option[4].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(0x18);
      *(undefined4 *)helper._0_8_ = 3;
      *(undefined8 *)(helper._0_8_ + 8) = uVar10;
      *(dxil_spv_option *)(helper._0_8_ + 0x10) = dVar3;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionOutputSwizzle,std::default_delete<dxil_spv::OptionOutputSwizzle>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_RASTERIZER_SAMPLE_COUNT:
      dVar3 = option[1].type;
      dVar4 = option[2].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      *(undefined4 *)helper._0_8_ = 4;
      *(dxil_spv_option *)(helper._0_8_ + 4) = dVar3;
      *(bool *)(helper._0_8_ + 8) = (char)dVar4 != DXIL_SPV_OPTION_INVALID;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRasterizerSampleCount,std::default_delete<dxil_spv::OptionRasterizerSampleCount>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_ROOT_CONSTANT_INLINE_UNIFORM_BLOCK:
      dVar3 = option[3].type;
      uVar10 = *(undefined8 *)(option + 1);
      helper._0_8_ = dxil_spv::allocate_in_thread(0x10);
      *(undefined4 *)helper._0_8_ = 5;
      *(undefined8 *)(helper._0_8_ + 4) = uVar10;
      *(bool *)(helper._0_8_ + 0xc) = (char)dVar3 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_BINDLESS_CBV_SSBO_EMULATION:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      uVar10 = 6;
      if ((char)dVar3 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
        uVar10 = 0x100000006;
      }
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_PHYSICAL_STORAGE_BUFFER:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      uVar10 = 7;
      if ((char)dVar3 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
        uVar10 = 0x100000007;
      }
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SBT_DESCRIPTOR_SIZE_LOG2:
      uVar10 = *(undefined8 *)(option + 1);
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      *(undefined4 *)helper._0_8_ = 8;
      *(undefined8 *)(helper._0_8_ + 4) = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SSBO_ALIGNMENT:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)dVar3 << 0x20 | 9;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSSBOAlignment,std::default_delete<dxil_spv::OptionSSBOAlignment>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_TYPED_UAV_READ_WITHOUT_FORMAT:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(byte)(char)dVar3 << 0x20 | 10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SHADER_SOURCE_FILE:
      helper.super_OptionBase.type = ShaderSourceFile;
      helper.name._M_dataplus._M_p = (pointer)&helper.name.field_2;
      helper.name._M_string_length = 0;
      helper.name.field_2._M_local_buf[0] = '\0';
      if (*(char **)(option + 2) != (char *)0x0) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::assign
                  (&helper.name,*(char **)(option + 2));
      }
      this.
      super__Tuple_impl<0UL,_dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
      .super__Head_base<0UL,_dxil_spv::OptionShaderSourceFile_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
            )dxil_spv::allocate_in_thread(0x28);
      dxil_spv::OptionShaderSourceFile::OptionShaderSourceFile
                ((OptionShaderSourceFile *)
                 this.
                 super__Tuple_impl<0UL,_dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
                 .super__Head_base<0UL,_dxil_spv::OptionShaderSourceFile_*,_false>._M_head_impl,
                 &helper);
      local_38._M_t.
      super__Tuple_impl<0UL,_dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
      .super__Head_base<0UL,_dxil_spv::OptionShaderSourceFile_*,_false>._M_head_impl =
           (tuple<dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
            )(tuple<dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
              )this.
               super__Tuple_impl<0UL,_dxil_spv::OptionShaderSourceFile_*,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
               .super__Head_base<0UL,_dxil_spv::OptionShaderSourceFile_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderSourceFile,std::default_delete<dxil_spv::OptionShaderSourceFile>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
                  *)&local_38);
      std::
      unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
                     *)&local_38);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                (&helper.name);
      break;
    case DXIL_SPV_OPTION_BINDLESS_TYPED_BUFFER_OFFSETS:
      uVar10 = 0xc;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x10000000c;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_BINDLESS_OFFSET_BUFFER_LAYOUT:
      dVar3 = option[3].type;
      uVar10 = *(undefined8 *)(option + 1);
      helper._0_8_ = dxil_spv::allocate_in_thread(0x10);
      *(undefined4 *)helper._0_8_ = 0xd;
      *(undefined8 *)(helper._0_8_ + 4) = uVar10;
      *(dxil_spv_option *)(helper._0_8_ + 0xc) = dVar3;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_STORAGE_INPUT_OUTPUT_16BIT:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      uVar10 = 0xe;
      if ((char)dVar3 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
        uVar10 = 0x10000000e;
      }
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionStorageInputOutput16,std::default_delete<dxil_spv::OptionStorageInputOutput16>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_DESCRIPTOR_QA:
      dVar4 = option[1].type;
      uVar10 = *(undefined8 *)(option + 8);
      dVar3 = option[6].type;
      uVar5 = *(undefined8 *)(option + 2);
      uVar6 = *(undefined8 *)(option + 4);
      helper._0_8_ = dxil_spv::allocate_in_thread(0x28);
      *(undefined4 *)helper._0_8_ = 0xf;
      *(bool *)(helper._0_8_ + 4) = (char)dVar4 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER;
      *(undefined8 *)(helper._0_8_ + 8) = uVar5;
      *(undefined8 *)(helper._0_8_ + 0x10) = uVar6;
      *(dxil_spv_option *)(helper._0_8_ + 0x18) = dVar3;
      *(undefined8 *)(helper._0_8_ + 0x20) = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDescriptorQA,std::default_delete<dxil_spv::OptionDescriptorQA>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>::
      ~unique_ptr((unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>
                   *)&helper);
      break;
    case DXIL_SPV_OPTION_MIN_PRECISION_NATIVE_16BIT:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      uVar10 = 0x10;
      if ((char)dVar3 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
        uVar10 = 0x100000010;
      }
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SHADER_I8_DOT:
      uVar10 = 0x11;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000011;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderI8Dot,std::default_delete<dxil_spv::OptionShaderI8Dot>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>::
      ~unique_ptr((unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>
                   *)&helper);
      break;
    case DXIL_SPV_OPTION_SHADER_RAY_TRACING_PRIMITIVE_CULLING:
      uVar10 = 0x12;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000012;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_INVARIANT_POSITION:
      uVar10 = 0x13;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000013;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionInvariantPosition,std::default_delete<dxil_spv::OptionInvariantPosition>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SCALAR_BLOCK_LAYOUT:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      uVar11 = 0x14;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x100000014;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionScalarBlockLayout,std::default_delete<dxil_spv::OptionScalarBlockLayout>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_BARYCENTRIC_KHR:
      uVar10 = 0x15;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000015;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBarycentricKHR,std::default_delete<dxil_spv::OptionBarycentricKHR>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_ROBUST_PHYSICAL_CBV_LOAD:
      uVar10 = 0x16;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000016;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_ARITHMETIC_RELAXED_PRECISION:
      uVar10 = 0x17;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000017;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_PHYSICAL_ADDRESS_DESCRIPTOR_INDEXING:
      uVar10 = *(undefined8 *)(option + 1);
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      *(undefined4 *)helper._0_8_ = 0x18;
      *(undefined8 *)(helper._0_8_ + 4) = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_FORCE_SUBGROUP_SIZE:
      dVar3 = option[1].type;
      dVar4 = option[2].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      *(undefined4 *)helper._0_8_ = 0x19;
      *(dxil_spv_option *)(helper._0_8_ + 4) = dVar3;
      *(bool *)(helper._0_8_ + 8) = (char)dVar4 != DXIL_SPV_OPTION_INVALID;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionForceSubgroupSize,std::default_delete<dxil_spv::OptionForceSubgroupSize>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_DENORM_PRESERVE_SUPPORT:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      uVar11 = 0x1a;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x10000001a;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDenormPreserveSupport,std::default_delete<dxil_spv::OptionDenormPreserveSupport>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_STRICT_HELPER_LANE_WAVE_OPS:
      uVar10 = 0x1b;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x10000001b;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SUBGROUP_PARTITIONED_NV:
      uVar10 = 0x1c;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x10000001c;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_DEAD_CODE_ELIMINATE:
      uVar10 = 0x1d;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x10000001d;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDeadCodeEliminate,std::default_delete<dxil_spv::OptionDeadCodeEliminate>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_PRECISE_CONTROL:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      uVar11 = 0x1e;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x10000001e;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionPreciseControl,std::default_delete<dxil_spv::OptionPreciseControl>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SAMPLE_GRAD_OPTIMIZATION_CONTROL:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      uVar11 = 0x1f;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x10000001f;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_OPACITY_MICROMAP:
      uVar10 = 0x20;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000020;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionOpacityMicromap,std::default_delete<dxil_spv::OptionOpacityMicromap>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_BRANCH_CONTROL:
      dVar4 = option[2].type;
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      local_48 = (char)dVar3;
      cStack_47 = (char)(dVar3 >> 8);
      cStack_46 = (char)(dVar3 >> 0x10);
      cStack_45 = (char)(dVar3 >> 0x18);
      *(undefined4 *)helper._0_8_ = 0x21;
      *(uint *)(helper._0_8_ + 4) =
           ~CONCAT13(-(cStack_45 == '\0'),
                     CONCAT12(-(cStack_46 == '\0'),
                              CONCAT11(-(cStack_47 == '\0'),-(local_48 == '\0')))) &
           (uint)DAT_001a0000;
      *(bool *)(helper._0_8_ + 8) = (char)dVar4 != DXIL_SPV_OPTION_INVALID;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBranchControl,std::default_delete<dxil_spv::OptionBranchControl>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SUBGROUP_PROPERTIES:
      uVar10 = *(undefined8 *)(option + 1);
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      *(undefined4 *)helper._0_8_ = 0x22;
      *(undefined8 *)(helper._0_8_ + 4) = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSubgroupProperties,std::default_delete<dxil_spv::OptionSubgroupProperties>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_DESCRIPTOR_HEAP_ROBUSTNESS:
      uVar10 = 0x23;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000023;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES_NV:
      uVar10 = 0x24;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000024;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_QUAD_CONTROL_RECONVERGENCE:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      bVar2 = *(byte *)((long)&option[1].type + 2);
      uVar11 = 0x25;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x100000025;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11 | (ulong)(bVar2 != 0) << 0x30;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionQuadControlReconvergence,std::default_delete<dxil_spv::OptionQuadControlReconvergence>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_RAW_ACCESS_CHAINS_NV:
      uVar10 = 0x26;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar10 = 0x100000026;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(undefined8 *)helper._0_8_ = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRawAccessChainsNV,std::default_delete<dxil_spv::OptionRawAccessChainsNV>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_DRIVER_VERSION:
      uVar10 = *(undefined8 *)(option + 1);
      helper._0_8_ = dxil_spv::allocate_in_thread(0xc);
      *(undefined4 *)helper._0_8_ = 0x27;
      *(undefined8 *)(helper._0_8_ + 4) = uVar10;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDriverVersion,std::default_delete<dxil_spv::OptionDriverVersion>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      uVar11 = 0x28;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x100000028;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionComputeShaderDerivatives,std::default_delete<dxil_spv::OptionComputeShaderDerivatives>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_INSTRUCTION_INSTRUMENTATION:
      dVar7 = option[1].type;
      dVar3 = option[6].type;
      uVar10 = *(undefined8 *)(option + 8);
      dVar4 = option[10].type;
      uVar5 = *(undefined8 *)(option + 2);
      uVar6 = *(undefined8 *)(option + 4);
      helper._0_8_ = dxil_spv::allocate_in_thread(0x30);
      *(undefined4 *)helper._0_8_ = 0x29;
      *(bool *)(helper._0_8_ + 4) = (char)dVar7 != DXIL_SPV_OPTION_INVALID;
      *(undefined8 *)(helper._0_8_ + 8) = uVar5;
      *(undefined8 *)(helper._0_8_ + 0x10) = uVar6;
      *(dxil_spv_option *)(helper._0_8_ + 0x18) = dVar3;
      *(undefined8 *)(helper._0_8_ + 0x20) = uVar10;
      *(dxil_spv_option *)(helper._0_8_ + 0x28) = dVar4;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionInstructionInstrumentation,std::default_delete<dxil_spv::OptionInstructionInstrumentation>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_SHADER_QUIRK:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)dVar3 << 0x20 | 0x2a;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderQuirk,std::default_delete<dxil_spv::OptionShaderQuirk>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>::
      ~unique_ptr((unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>
                   *)&helper);
      break;
    case DXIL_SPV_OPTION_EXTENDED_ROBUSTNESS:
      bVar1 = *(byte *)((long)&option[1].type + 1);
      bVar2 = *(byte *)((long)&option[1].type + 2);
      uVar11 = 0x2b;
      if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
        uVar11 = 0x10000002b;
      }
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)(bVar1 != 0) << 0x28 | uVar11 | (ulong)(bVar2 != 0) << 0x30;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionExtendedRobustness,std::default_delete<dxil_spv::OptionExtendedRobustness>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
                     *)&helper);
      break;
    case DXIL_SPV_OPTION_MAX_TESS_FACTOR:
      dVar3 = option[1].type;
      helper._0_8_ = dxil_spv::allocate_in_thread(8);
      *(ulong *)helper._0_8_ = (ulong)dVar3 << 0x20 | 0x2c;
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionMaxTessFactor,std::default_delete<dxil_spv::OptionMaxTessFactor>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
                  *)&helper);
      std::
      unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
                     *)&helper);
      break;
    default:
      goto switchD_001076ca_default;
    }
    dVar9 = DXIL_SPV_SUCCESS;
  }
switchD_001076ca_default:
  return dVar9;
}

Assistant:

dxil_spv_result dxil_spv_converter_add_option(dxil_spv_converter converter, const dxil_spv_option_base *option)
{
	if (!dxil_spv_converter_supports_option(option->type))
		return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;

	switch (option->type)
	{
	case DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER:
	{
		OptionShaderDemoteToHelper helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_demote_to_helper *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DUAL_SOURCE_BLENDING:
	{
		OptionDualSourceBlending helper;
		helper.enabled = bool(reinterpret_cast<const dxil_spv_option_dual_source_blending *>(option)->enabled);
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_OUTPUT_SWIZZLE:
	{
		OptionOutputSwizzle helper;
		const auto *input = reinterpret_cast<const dxil_spv_option_output_swizzle *>(option);
		helper.swizzles = input->swizzles;
		helper.swizzle_count = input->swizzle_count;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_RASTERIZER_SAMPLE_COUNT:
	{
		OptionRasterizerSampleCount helper;
		const auto *count = reinterpret_cast<const dxil_spv_option_rasterizer_sample_count *>(option);
		helper.count = count->sample_count;
		helper.spec_constant = bool(count->spec_constant);
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ROOT_CONSTANT_INLINE_UNIFORM_BLOCK:
	{
		OptionRootConstantInlineUniformBlock helper;
		const auto *ubo = reinterpret_cast<const dxil_spv_option_root_constant_inline_uniform_block *>(option);
		helper.desc_set = ubo->desc_set;
		helper.binding = ubo->binding;
		helper.enable = ubo->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_CBV_SSBO_EMULATION:
	{
		OptionBindlessCBVSSBOEmulation helper;
		helper.enable =
		    reinterpret_cast<const dxil_spv_option_bindless_cbv_ssbo_emulation *>(option)->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PHYSICAL_STORAGE_BUFFER:
	{
		OptionPhysicalStorageBuffer helper;
		helper.enable =
		    reinterpret_cast<const dxil_spv_option_physical_storage_buffer *>(option)->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SBT_DESCRIPTOR_SIZE_LOG2:
	{
		OptionSBTDescriptorSizeLog2 helper;
		helper.size_log2_srv_uav_cbv = reinterpret_cast<const dxil_spv_option_sbt_descriptor_size_log2 *>(option)->size_log2_srv_uav_cbv;
		helper.size_log2_sampler = reinterpret_cast<const dxil_spv_option_sbt_descriptor_size_log2 *>(option)->size_log2_sampler;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SSBO_ALIGNMENT:
	{
		OptionSSBOAlignment helper;
		helper.alignment = reinterpret_cast<const dxil_spv_option_ssbo_alignment *>(option)->alignment;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_TYPED_UAV_READ_WITHOUT_FORMAT:
	{
		OptionTypedUAVReadWithoutFormat helper;
		helper.supported = reinterpret_cast<const dxil_spv_option_typed_uav_read_without_format *>(option)->supported == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_SOURCE_FILE:
	{
		OptionShaderSourceFile helper;
		const char *name = reinterpret_cast<const dxil_spv_option_shader_source_file *>(option)->name;
		if (name)
			helper.name = name;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_TYPED_BUFFER_OFFSETS:
	{
		OptionBindlessTypedBufferOffsets helper;
		helper.enable = reinterpret_cast<const dxil_spv_option_bindless_typed_buffer_offsets *>(option)->enable;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_OFFSET_BUFFER_LAYOUT:
	{
		OptionBindlessOffsetBufferLayout helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_bindless_offset_buffer_layout *>(option);
		helper.untyped_offset = opt->untyped_offset;
		helper.typed_offset = opt->typed_offset;
		helper.stride = opt->stride;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_STORAGE_INPUT_OUTPUT_16BIT:
	{
		OptionStorageInputOutput16 helper;
		helper.supported =
		    reinterpret_cast<const dxil_spv_option_storage_input_output_16bit *>(option)->supported == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DESCRIPTOR_QA:
	{
		OptionDescriptorQA helper;
		auto *qa = reinterpret_cast<const dxil_spv_option_descriptor_qa *>(option);
		helper.enabled = qa->enabled == DXIL_SPV_TRUE;
		helper.shader_hash = qa->shader_hash;
		helper.global_desc_set = qa->global_desc_set;
		helper.global_binding = qa->global_binding;
		helper.heap_desc_set = qa->heap_desc_set;
		helper.heap_binding = qa->heap_binding;
		helper.version = qa->version;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_MIN_PRECISION_NATIVE_16BIT:
	{
		OptionMinPrecisionNative16Bit helper;
		auto *minprec = reinterpret_cast<const dxil_spv_option_min_precision_native_16bit *>(option);
		helper.enabled = minprec->enabled == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_I8_DOT:
	{
		OptionShaderI8Dot helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_i8_dot *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_RAY_TRACING_PRIMITIVE_CULLING:
	{
		OptionShaderRayTracingPrimitiveCulling helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_ray_tracing_primitive_culling *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_INVARIANT_POSITION:
	{
		OptionInvariantPosition helper;
		helper.enabled = bool(reinterpret_cast<const dxil_spv_option_invariant_position *>(option)->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SCALAR_BLOCK_LAYOUT:
	{
		OptionScalarBlockLayout helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_scalar_block_layout *>(option);
		helper.supported = bool(opt->supported);
		helper.supports_per_component_robustness = bool(opt->supports_per_component_robustness);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BARYCENTRIC_KHR:
	{
		OptionBarycentricKHR helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_barycentric_khr *>(option);
		helper.supported = bool(opt->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ROBUST_PHYSICAL_CBV_LOAD:
	{
		OptionRobustPhysicalCBVLoad helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_robust_physical_cbv_load *>(option);
		helper.enabled = bool(robust->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ARITHMETIC_RELAXED_PRECISION:
	{
		OptionArithmeticRelaxedPrecision helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_arithmetic_relaxed_precision *>(option);
		helper.enabled = bool(robust->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PHYSICAL_ADDRESS_DESCRIPTOR_INDEXING:
	{
		OptionPhysicalAddressDescriptorIndexing helper;
		auto *indexing = reinterpret_cast<const dxil_spv_option_physical_address_descriptor_indexing *>(option);
		helper.element_stride = indexing->element_stride;
		helper.element_offset = indexing->element_offset;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_FORCE_SUBGROUP_SIZE:
	{
		OptionForceSubgroupSize helper;
		auto *subgroup = reinterpret_cast<const dxil_spv_option_force_subgroup_size *>(option);
		helper.forced_value = subgroup->forced_value;
		helper.wave_size_enable = subgroup->wave_size_enable;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DENORM_PRESERVE_SUPPORT:
	{
		OptionDenormPreserveSupport helper;
		auto *denorm = reinterpret_cast<const dxil_spv_option_denorm_preserve_support *>(option);
		helper.support_float16_denorm_preserve = bool(denorm->supports_float16_denorm_preserve);
		helper.support_float64_denorm_preserve = bool(denorm->supports_float64_denorm_preserve);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_STRICT_HELPER_LANE_WAVE_OPS:
	{
		OptionStrictHelperLaneWaveOps helper;
		auto *strict = reinterpret_cast<const dxil_spv_option_strict_helper_lane_wave_ops *>(option);
		helper.enable = strict->enable;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SUBGROUP_PARTITIONED_NV:
	{
		OptionSubgroupPartitionedNV helper;
		auto *partitioned = reinterpret_cast<const dxil_spv_option_subgroup_partitioned_nv *>(option);
		helper.supported = partitioned->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DEAD_CODE_ELIMINATE:
	{
		OptionDeadCodeEliminate helper;
		auto *eliminate = reinterpret_cast<const dxil_spv_option_dead_code_eliminate *>(option);
		helper.enabled = eliminate->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PRECISE_CONTROL:
	{
		OptionPreciseControl helper;
		auto *precise = reinterpret_cast<const dxil_spv_option_precise_control *>(option);
		helper.force_precise = precise->force_precise;
		helper.propagate_precise = precise->propagate_precise;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SAMPLE_GRAD_OPTIMIZATION_CONTROL:
	{
		OptionSampleGradOptimizationControl helper;
		auto *precise = reinterpret_cast<const dxil_spv_option_sample_grad_optimization_control *>(option);
		helper.enabled = precise->enabled;
		helper.assume_uniform_scale = precise->assume_uniform_scale;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_OPACITY_MICROMAP:
	{
		OptionOpacityMicromap helper;
		auto *omm = reinterpret_cast<const dxil_spv_option_opacity_micromap *>(option);
		helper.enabled = omm->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BRANCH_CONTROL:
	{
		OptionBranchControl helper;
		auto *branch = reinterpret_cast<const dxil_spv_option_branch_control *>(option);
		helper.use_shader_metadata = branch->use_shader_metadata;
		helper.force_branch = branch->force_branch;
		helper.force_loop = branch->force_loop;
		helper.force_unroll = branch->force_unroll;
		helper.force_flatten = branch->force_flatten;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SUBGROUP_PROPERTIES:
	{
		OptionSubgroupProperties helper;
		auto *sub = reinterpret_cast<const dxil_spv_option_subgroup_properties *>(option);
		helper.minimum_size = sub->minimum_size;
		helper.maximum_size = sub->maximum_size;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DESCRIPTOR_HEAP_ROBUSTNESS:
	{
		OptionDescriptorHeapRobustness helper;
		auto *rob = reinterpret_cast<const dxil_spv_option_descriptor_heap_robustness *>(option);
		helper.enabled = rob->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES_NV:
	{
		OptionComputeShaderDerivativesNV helper;
		auto *deriv = reinterpret_cast<const dxil_spv_option_compute_shader_derivatives_nv *>(option);
		helper.supported = deriv->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_QUAD_CONTROL_RECONVERGENCE:
	{
		OptionQuadControlReconvergence helper;
		auto *quad = reinterpret_cast<const dxil_spv_option_quad_control_reconvergence *>(option);
		helper.supports_quad_control = quad->supports_quad_control;
		helper.supports_maximal_reconvergence = quad->supports_maximal_reconvergence;
		helper.force_maximal_reconvergence = quad->force_maximal_reconvergence;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_RAW_ACCESS_CHAINS_NV:
	{
		OptionRawAccessChainsNV helper;
		auto *chain = reinterpret_cast<const dxil_spv_option_raw_access_chains_nv *>(option);
		helper.supported = chain->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DRIVER_VERSION:
	{
		OptionDriverVersion helper;
		auto *ver = reinterpret_cast<const dxil_spv_option_driver_version *>(option);
		helper.driver_id = ver->driver_id;
		helper.driver_version = ver->driver_version;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES:
	{
		OptionComputeShaderDerivatives helper;
		auto *deriv = reinterpret_cast<const dxil_spv_option_compute_shader_derivatives *>(option);
		helper.supports_nv = deriv->supports_nv;
		helper.supports_khr = deriv->supports_khr;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_INSTRUCTION_INSTRUMENTATION:
	{
		OptionInstructionInstrumentation helper;
		auto *inst = reinterpret_cast<const dxil_spv_option_instruction_instrumentation *>(option);
		helper.enabled = inst->enabled;
		helper.version = inst->version;
		helper.control_desc_set = inst->control_desc_set;
		helper.control_binding = inst->control_binding;
		helper.payload_desc_set = inst->payload_desc_set;
		helper.payload_binding = inst->payload_binding;
		helper.shader_hash = inst->shader_hash;
		helper.type = InstructionInstrumentationType(inst->type);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_QUIRK:
	{
		OptionShaderQuirk helper;
		auto *quirk = reinterpret_cast<const dxil_spv_option_shader_quirk *>(option);
		helper.quirk = static_cast<ShaderQuirk>(quirk->quirk);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_EXTENDED_ROBUSTNESS:
	{
		OptionExtendedRobustness helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_extended_robustness *>(option);
		helper.robust_group_shared = robust->robust_group_shared;
		helper.robust_alloca = robust->robust_alloca;
		helper.robust_constant_lut = robust->robust_constant_lut;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_MAX_TESS_FACTOR:
	{
		OptionMaxTessFactor helper;
		auto *tess_factor = reinterpret_cast<const dxil_spv_option_max_tess_factor *>(option);
		helper.max_tess_factor = tess_factor->max_tess_factor;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	default:
		return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
	}

	return DXIL_SPV_SUCCESS;
}